

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_ClearRGBA(GPU_Target *target,Uint8 r,Uint8 g,Uint8 b,Uint8 a)

{
  Uint8 a_local;
  Uint8 b_local;
  Uint8 g_local;
  Uint8 r_local;
  GPU_Target *target_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("GPU_ClearRGBA",GPU_ERROR_USER_ERROR,"%s","NULL renderer");
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_ClearRGBA",GPU_ERROR_USER_ERROR,"%s","NULL context");
    }
    else {
      (*_gpu_current_renderer->impl->ClearRGBA)(_gpu_current_renderer,target,r,g,b,a);
    }
  }
  return;
}

Assistant:

void GPU_ClearRGBA(GPU_Target* target, Uint8 r, Uint8 g, Uint8 b, Uint8 a)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->ClearRGBA(_gpu_current_renderer, target, r, g, b, a);
}